

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnBrTableTarget(TypeChecker *this,Index depth)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _anonymous_namespace_ *in_RCX;
  string local_80;
  string local_60;
  Result local_40;
  Enum local_3c;
  _anonymous_namespace_ *local_38;
  TypeVector *label_sig;
  Label *local_28;
  Label *label;
  Result result;
  Index depth_local;
  TypeChecker *this_local;
  
  label._4_4_ = depth;
  _result = this;
  Result::Result((Result *)&label,Ok);
  label_sig._4_4_ = GetLabel(this,label._4_4_,&local_28);
  bVar1 = Failed(label_sig._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_38 = (_anonymous_namespace_ *)Label::br_types(local_28);
    local_3c = (Enum)CheckSignature(this,(TypeVector *)local_38,"br_table");
    Result::operator|=((Result *)&label,(Result)local_3c);
    if (this->br_table_sig_ == (TypeVector *)0x0) {
      this->br_table_sig_ = (TypeVector *)local_38;
      in_RCX = local_38;
    }
    bVar1 = std::operator!=(this->br_table_sig_,
                            (vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_38);
    if (bVar1) {
      Result::Result(&local_40,Error);
      Result::operator|=((Result *)&label,local_40);
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)this->br_table_sig_,(TypeVector *)0x0,
                 (char *)in_RCX);
      uVar2 = std::__cxx11::string::c_str((string *)&local_60);
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_80,local_38,(TypeVector *)0x0,(char *)in_RCX);
      uVar3 = std::__cxx11::string::c_str((string *)&local_80);
      PrintError(this,"br_table labels have inconsistent types: expected %s, got %s",uVar2,uVar3);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
    }
    this_local._4_4_ = (Enum)label;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnBrTableTarget(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckSignature(label_sig, "br_table");

  // Make sure this label's signature is consistent with the previous labels'
  // signatures.
  if (br_table_sig_ == nullptr) {
    br_table_sig_ = &label_sig;
  }
  if (*br_table_sig_ != label_sig) {
    result |= Result::Error;
    PrintError("br_table labels have inconsistent types: expected %s, got %s",
               TypesToString(*br_table_sig_).c_str(),
               TypesToString(label_sig).c_str());
  }

  return result;
}